

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compaction.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  result_type rVar2;
  int iVar3;
  ostream *poVar4;
  char *__command;
  rep rVar5;
  duration<long,_std::ratio<1L,_1000000000L>_> local_4fb8;
  duration<long,_std::ratio<1L,_1L>_> local_4fb0;
  rep local_4fa8;
  rep totalTime;
  time_point end;
  duration<long,_std::ratio<1L,_1000000L>_> local_4f90;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_4f88;
  time_point e;
  time_point s;
  int local_4f70;
  int i;
  int ii;
  int sec;
  unsigned_long_long mis;
  string local_4f58 [8];
  string value;
  undefined1 local_4f38 [8];
  KVStore store;
  string cmd;
  string local_2788 [32];
  int local_2768;
  int local_2764;
  int f;
  int remain;
  mt19937 mt;
  random_device rd;
  time_point start;
  allocator local_31;
  string local_30 [8];
  string path;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"../data",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  rd.field_0._M_mt._M_p = std::chrono::_V2::system_clock::now();
  poVar4 = std::operator<<((ostream *)&std::cout,">>>>> Compaction Test <<<<<");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::random_device::random_device((random_device *)&mt._M_p);
  rVar2 = std::random_device::operator()((random_device *)&mt._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&f,(ulong)rVar2);
  local_2764 = 0x1fa900;
  local_2768 = 10;
  std::__cxx11::string::string(local_2788,local_30);
  bVar1 = utils::dirExists((string *)local_2788);
  std::__cxx11::string::~string(local_2788);
  if (bVar1) {
    std::operator+((char *)&store.cache._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"rm -rf ");
    __command = (char *)std::__cxx11::string::c_str();
    system(__command);
    std::__cxx11::string::~string
              ((string *)&store.cache._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  KVStore::KVStore((KVStore *)local_4f38,(string *)local_30);
  iVar3 = local_2764 / local_2768;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f58,(long)iVar3,'s',(allocator *)((long)&mis + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&mis + 7));
  _ii = 0;
  i = 0;
  local_4f70 = 0;
  for (s.__d.__r._4_4_ = 0;
      SBORROW4(s.__d.__r._4_4_,local_2768 * 5000) != s.__d.__r._4_4_ + local_2768 * -5000 < 0;
      s.__d.__r._4_4_ = s.__d.__r._4_4_ + 1) {
    e.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    KVStore::put((KVStore *)local_4f38,(long)s.__d.__r._4_4_,(string *)local_4f58);
    local_4f88.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    end.__d.__r = std::chrono::operator-(&local_4f88,&e);
    local_4f90.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                        (&end.__d);
    rVar5 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_4f90);
    _ii = rVar5 + _ii;
    if ((ulong)(long)i < _ii / 1000000) {
      poVar4 = (ostream *)
               std::ostream::operator<<((ostream *)&std::cout,s.__d.__r._4_4_ - local_4f70);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      local_4f70 = s.__d.__r._4_4_;
      i = i + 1;
    }
  }
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_2768);
  poVar4 = std::operator<<(poVar4," puts per compaction, Delay: ");
  poVar4 = (ostream *)
           std::ostream::operator<<
                     (poVar4,(double)SUB168((ZEXT816(0) * ZEXT816(0x20c49ba5e353f7cf) >> 0x44 &
                                            (undefined1  [16])0xfffffffffffffff) *
                                            ZEXT816(0x4189374bc6a7f0),8) /
                             (double)(local_2768 * 100));
  poVar4 = std::operator<<(poVar4,"ms");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  totalTime = std::chrono::_V2::system_clock::now();
  local_4fb8.__r =
       (rep)std::chrono::operator-
                      ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&totalTime,
                       (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&rd.field_0._M_mt._M_p);
  local_4fb0.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                      (&local_4fb8);
  local_4fa8 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_4fb0);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,">>>>> Summary <<<<<");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"It takes ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_4fa8);
  poVar4 = std::operator<<(poVar4,"s to complete the test.");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_4f58);
  KVStore::~KVStore((KVStore *)local_4f38);
  std::random_device::~random_device((random_device *)&mt._M_p);
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

int main() {
  string path = "../data";

  auto start = high_resolution_clock::now();
  cout << ">>>>> Compaction Test <<<<<" << endl;

  random_device rd;
  mt19937 mt(rd());

  int remain = 2 * 1024 * 1024 - 32 - 10240 - 1000 * 12;

  auto f = 10;

  if (utils::dirExists(path)) {
    string cmd = "rm -rf " + path;
    system(cmd.c_str());
  }
  KVStore store(path);
  string value(remain / f, 's');

  unsigned long long mis = 0;
  int sec = 0;
  int ii = 0;
  for (int i = 0; i < f * 5000; i++) {
    auto s = high_resolution_clock::now();
    store.put(i, value);
    auto e = high_resolution_clock::now();
    mis += duration_cast<microseconds>(e - s).count();
    if (mis / 1000 / 1000 > sec) {
      cout << i - ii << endl;
      ii = i;
      sec++;
    }
  }
  cout << f << " puts per compaction, Delay: "
       << mis / 1000 / 1000 / (double)(f * 100) << "ms" << endl;

  // cout << "no compaction, ";
  // µs = 0;
  // KVStore store2(path);
  // for (int i = 0; i < 200000; i++) {
  //   auto key = mt();
  //   auto s = high_resolution_clock::now();
  //   store2.put(key, "s");
  //   auto e = high_resolution_clock::now();
  //   µs += duration_cast<nanoseconds>(e - s).count();
  // }
  // cout << "Delay: " << µs / 1000 / 1000 / (double)(200000) << "ms" << endl;

  auto end = high_resolution_clock::now();
  auto totalTime = duration_cast<seconds>(end - start).count();

  cout << endl;
  cout << ">>>>> Summary <<<<<" << endl;
  cout << "It takes " << totalTime << "s to complete the test." << endl;
}